

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

uint32_t uprv_decNumberToUInt32_63(decNumber *dn,decContext *set)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  bool bVar6;
  
  if ((dn->bits & 0x70) == 0) {
    iVar1 = dn->digits;
    if (((long)iVar1 < 0xb) && (dn->exponent == 0)) {
      bVar2 = dn->lsu[0];
      if ((char)dn->bits < '\0') {
        bVar6 = bVar2 != 0;
        bVar2 = 0;
        uVar3 = 0;
        if (iVar1 != 1 || bVar6) goto LAB_00243381;
      }
      else {
        uVar3 = 0;
        if (1 < iVar1) {
          pbVar4 = &dn->field_0xa;
          lVar5 = 0;
          uVar3 = 0;
          do {
            uVar3 = uVar3 + (uint)*pbVar4 * *(int *)((long)DECPOWERS + lVar5);
            pbVar4 = pbVar4 + 1;
            lVar5 = lVar5 + 4;
          } while ((long)iVar1 * 4 + -4 != lVar5);
          if ((0x19999999 < uVar3) || (uVar3 == 0x19999999 && 5 < bVar2)) goto LAB_00243381;
        }
      }
      return (uint)bVar2 + uVar3 * 10;
    }
  }
LAB_00243381:
  uprv_decContextSetStatus_63(set,0x80);
  return 0;
}

Assistant:

U_CAPI uInt U_EXPORT2 uprv_decNumberToUInt32(const decNumber *dn, decContext *set) {
  #if DECCHECK
  if (decCheckOperands(DECUNRESU, DECUNUSED, dn, set)) return 0;
  #endif
  /* special or too many digits, or bad exponent, or negative (<0)  */
  if (dn->bits&DECSPECIAL || dn->digits>10 || dn->exponent!=0
    || (dn->bits&DECNEG && !ISZERO(dn)));                   /* bad  */
   else { /* is a finite integer with 10 or fewer digits  */
    Int d;                         /* work  */
    const Unit *up;                /* ..  */
    uInt hi=0, lo;                 /* ..  */
    up=dn->lsu;                    /* -> lsu  */
    lo=*up;                        /* get 1 to 9 digits  */
    #if DECDPUN>1                  /* split to higher  */
      hi=lo/10;
      lo=lo%10;
    #endif
    up++;
    /* collect remaining Units, if any, into hi  */
    for (d=DECDPUN; d<dn->digits; up++, d+=DECDPUN) hi+=*up*powers[d-1];

    /* now low has the lsd, hi the remainder  */
    if (hi>429496729 || (hi==429496729 && lo>5)) ; /* no reprieve possible  */
     else return X10(hi)+lo;
    } /* integer  */
  uprv_decContextSetStatus(set, DEC_Invalid_operation); /* [may not return]  */
  return 0;
  }